

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configset.hh
# Opt level: O0

bool __thiscall
utilmm::config_set::get<bool>(config_set *this,string *name,bool *defval,type *enabler)

{
  value_type vVar1;
  reference pvVar2;
  list<bool,_std::allocator<bool>_> local_68;
  undefined1 local_40 [8];
  list<bool,_std::allocator<bool>_> deflist;
  type *enabler_local;
  bool *defval_local;
  string *name_local;
  config_set *this_local;
  
  deflist.super__List_base<bool,_std::allocator<bool>_>._M_impl._M_node._M_size = (size_t)enabler;
  std::__cxx11::list<bool,_std::allocator<bool>_>::list
            ((list<bool,_std::allocator<bool>_> *)local_40);
  std::__cxx11::list<bool,_std::allocator<bool>_>::push_back
            ((list<bool,_std::allocator<bool>_> *)local_40,defval);
  get<std::__cxx11::list<bool,std::allocator<bool>>>
            (&local_68,this,name,(list<bool,_std::allocator<bool>_> *)local_40,(type *)0x0);
  pvVar2 = std::__cxx11::list<bool,_std::allocator<bool>_>::front(&local_68);
  vVar1 = *pvVar2;
  std::__cxx11::list<bool,_std::allocator<bool>_>::~list(&local_68);
  std::__cxx11::list<bool,_std::allocator<bool>_>::~list
            ((list<bool,_std::allocator<bool>_> *)local_40);
  return (bool)(vVar1 & 1);
}

Assistant:

T config_set::get(std::string const& name, T const& defval,
            typename boost::disable_if< details::is_list<T> >::type *enabler) const
    {
        std::list<T> deflist;
        deflist.push_back(defval);
        return get< std::list<T> >(name, deflist).front();
    }